

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

int weapon_lookup(char *name)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  difference_type dVar2;
  anon_class_8_1_898f2789_for__M_pred in_RDI;
  __normal_iterator<const_weapon_type_*,_std::vector<weapon_type,_std::allocator<weapon_type>_>_> it
  ;
  vector<weapon_type,_std::allocator<weapon_type>_> *in_stack_ffffffffffffffb8;
  int iVar3;
  __normal_iterator<const_weapon_type_*,_std::vector<weapon_type,_std::allocator<weapon_type>_>_>
  *in_stack_ffffffffffffffc0;
  
  __first = std::vector<weapon_type,_std::allocator<weapon_type>_>::begin(in_stack_ffffffffffffffb8)
  ;
  __last = std::vector<weapon_type,_std::allocator<weapon_type>_>::end(in_stack_ffffffffffffffb8);
  std::
  find_if<__gnu_cxx::__normal_iterator<weapon_type_const*,std::vector<weapon_type,std::allocator<weapon_type>>>,weapon_lookup(char_const*)::__0>
            ((__normal_iterator<const_weapon_type_*,_std::vector<weapon_type,_std::allocator<weapon_type>_>_>
              )__first._M_current,
             (__normal_iterator<const_weapon_type_*,_std::vector<weapon_type,_std::allocator<weapon_type>_>_>
              )__last._M_current,in_RDI);
  std::vector<weapon_type,_std::allocator<weapon_type>_>::end(in_stack_ffffffffffffffb8);
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_ffffffffffffffc0,
                     (__normal_iterator<const_weapon_type_*,_std::vector<weapon_type,_std::allocator<weapon_type>_>_>
                      *)in_stack_ffffffffffffffb8);
  if (bVar1) {
    std::vector<weapon_type,_std::allocator<weapon_type>_>::begin(in_stack_ffffffffffffffb8);
    dVar2 = __gnu_cxx::operator-
                      (in_stack_ffffffffffffffc0,
                       (__normal_iterator<const_weapon_type_*,_std::vector<weapon_type,_std::allocator<weapon_type>_>_>
                        *)in_stack_ffffffffffffffb8);
    iVar3 = (int)dVar2;
  }
  else {
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int weapon_lookup(const char *name)
{
	auto it = std::find_if(weapon_table.begin(), weapon_table.end(), [name] (auto weapon) {
		return weapon.name != nullptr && !str_prefix(name, weapon.name);
	});

	return it != weapon_table.end()
		? it - weapon_table.begin()
		: -1;
}